

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void flatbuffers::anon_unknown_0::DeserializeDoc
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *doc,Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation)

{
  uint uVar1;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *this;
  uint uVar2;
  return_type this_00;
  string local_40;
  uint local_1c;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVStack_18;
  uoffset_t index;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *doc_local;
  
  if (documentation != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) {
    pVStack_18 = documentation;
    documentation_local = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)doc;
    for (local_1c = 0; uVar1 = local_1c,
        uVar2 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(pVStack_18),
        this = documentation_local, uVar1 < uVar2; local_1c = local_1c + 1) {
      this_00 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                          (pVStack_18,local_1c);
      String::str_abi_cxx11_(&local_40,this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

static void DeserializeDoc(std::vector<std::string> &doc,
                           const Vector<Offset<String>> *documentation) {
  if (documentation == nullptr) return;
  for (uoffset_t index = 0; index < documentation->size(); index++)
    doc.push_back(documentation->Get(index)->str());
}